

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation.cc
# Opt level: O3

bool __thiscall
sptk::InputSourceInterpolation::Get
          (InputSourceInterpolation *this,vector<double,_std::allocator<double>_> *buffer)

{
  int iVar1;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  size_t sVar6;
  double *pdVar7;
  bool bVar8;
  
  if (((buffer == (vector<double,_std::allocator<double>_> *)0x0) || (this->is_valid_ != true)) ||
     (this->remained_num_samples_ < 1)) {
    bVar8 = false;
  }
  else {
    if ((long)(buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->data_length_) {
      std::vector<double,_std::allocator<double>_>::resize(buffer,(long)this->data_length_);
    }
    pdVar2 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2;
    if (sVar6 != 0) {
      memmove((buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,pdVar2,sVar6);
    }
    iVar5 = this->remained_num_samples_;
    this->remained_num_samples_ = iVar5 + -1;
    if (iVar5 < 2) {
      bVar8 = true;
      if (this->use_final_frame_for_exceeded_frame_ == true) {
        this->remained_num_samples_ = 1;
      }
    }
    else {
      iVar5 = this->point_index_in_frame_ + 1;
      this->point_index_in_frame_ = iVar5;
      if (iVar5 % this->frame_period_ == 0) {
        pdVar2 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar6 = (long)(this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_finish - (long)pdVar2;
        if (sVar6 != 0) {
          memmove((this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,pdVar2,sVar6);
        }
        iVar5 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&this->next_data_);
        if ((char)iVar5 == '\0') {
          pdVar2 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar5 = 1;
          sVar6 = (long)(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
          if (sVar6 != 0) {
            memmove((this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,pdVar2,sVar6);
          }
        }
        else {
          iVar5 = this->frame_period_ + 1;
        }
        this->remained_num_samples_ = iVar5;
        if (0 < this->interpolation_period_) {
          CalculateIncrement(this);
        }
        this->point_index_in_frame_ = 0;
        bVar8 = true;
      }
      else {
        iVar1 = this->interpolation_period_;
        if (iVar1 < 1) {
          bVar8 = true;
          if (this->frame_period_ / 2 == iVar5 && iVar1 == 0) {
            pdVar2 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar6 = (long)(this->next_data_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
            if (sVar6 != 0) {
              memmove((this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start,pdVar2,sVar6);
            }
          }
        }
        else {
          bVar8 = true;
          if ((iVar5 + this->first_interpolation_period_) % iVar1 == 0) {
            pdVar4 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar3 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pdVar4 != pdVar3) {
              pdVar7 = (this->increment_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              do {
                *pdVar4 = *pdVar4 + *pdVar7;
                pdVar4 = pdVar4 + 1;
                pdVar7 = pdVar7 + 1;
              } while (pdVar4 != pdVar3);
            }
          }
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool InputSourceInterpolation::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }

  if (remained_num_samples_ <= 0) {
    return false;
  }

  if (buffer->size() != static_cast<std::size_t>(data_length_)) {
    buffer->resize(data_length_);
  }

  std::copy(curr_data_.begin(), curr_data_.end(), buffer->begin());

  --remained_num_samples_;

  if (remained_num_samples_ <= 0) {
    if (use_final_frame_for_exceeded_frame_) {
      remained_num_samples_ = 1;
    }
    return true;
  }

  // Update internal states for the next call.
  ++point_index_in_frame_;

  if (0 == point_index_in_frame_ % frame_period_) {
    // Update current and next data.
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
    if (!source_->Get(&next_data_)) {
      // Use the final data until the end of input sequence.
      std::copy(curr_data_.begin(), curr_data_.end(), next_data_.begin());
      remained_num_samples_ = 1;
    } else {
      remained_num_samples_ = frame_period_ + 1;
    }

    if (0 < interpolation_period_) {
      CalculateIncrement();
    }

    // Rewind point index.
    point_index_in_frame_ = 0;
  } else if (0 < interpolation_period_ &&
             0 == ((point_index_in_frame_ + first_interpolation_period_) %
                   interpolation_period_)) {
    // Interpolate adjacent data.
    std::transform(curr_data_.begin(), curr_data_.end(), increment_.begin(),
                   curr_data_.begin(), std::plus<double>());
  } else if (0 == interpolation_period_ &&
             frame_period_ / 2 == point_index_in_frame_) {
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
  }

  return true;
}